

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

tab_str_t *
str_add(tab_str_t *__return_storage_ptr__,c2m_ctx_t c2m_ctx,char *s,size_t len,size_t key,
       size_t flags,int key_p)

{
  tab_str_t el_00;
  tab_str_t el_01;
  int iVar1;
  char *__dest;
  tab_str_t str;
  tab_str_t el;
  char *heap_s;
  size_t flags_local;
  size_t key_local;
  size_t len_local;
  char *s_local;
  c2m_ctx_t c2m_ctx_local;
  
  iVar1 = str_exists_p(c2m_ctx,s,len,(tab_str_t *)&str.flags);
  if (iVar1 == 0) {
    __dest = (char *)reg_malloc(c2m_ctx,len);
    memcpy(__dest,s,len);
    el_00.str.len = len;
    el_00.str.s = __dest;
    el_00.key = key;
    el_00.flags = flags;
    str.str.s = (char *)len;
    str.str.len = key;
    str.key = flags;
    HTAB_tab_str_t_do(c2m_ctx->str_tab,el_00,HTAB_INSERT,(tab_str_t *)&str.flags);
    if (key_p != 0) {
      el_01.str.len = (size_t)str.str.s;
      el_01.str.s = __dest;
      el_01.key = str.str.len;
      el_01.flags = str.key;
      HTAB_tab_str_t_do(c2m_ctx->str_key_tab,el_01,HTAB_INSERT,(tab_str_t *)&str.flags);
    }
    (__return_storage_ptr__->str).s = __dest;
    (__return_storage_ptr__->str).len = (size_t)str.str.s;
    __return_storage_ptr__->key = str.str.len;
    __return_storage_ptr__->flags = str.key;
  }
  else {
    (__return_storage_ptr__->str).s = (char *)str.flags;
    (__return_storage_ptr__->str).len = (size_t)el.str.s;
    __return_storage_ptr__->key = el.str.len;
    __return_storage_ptr__->flags = el.key;
  }
  return __return_storage_ptr__;
}

Assistant:

static tab_str_t str_add (c2m_ctx_t c2m_ctx, const char *s, size_t len, size_t key, size_t flags,
                          int key_p) {
  char *heap_s;
  tab_str_t el, str;

  if (str_exists_p (c2m_ctx, s, len, &el)) return el;
  heap_s = reg_malloc (c2m_ctx, len);
  memcpy (heap_s, s, len);
  str.str.s = heap_s;
  str.str.len = len;
  str.key = key;
  str.flags = flags;
  HTAB_DO (tab_str_t, str_tab, str, HTAB_INSERT, el);
  if (key_p) HTAB_DO (tab_str_t, str_key_tab, str, HTAB_INSERT, el);
  return str;
}